

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O2

ssize_t tnt_io_sendv_raw(tnt_stream_net *s,iovec *iov,int count,int all)

{
  tnt_iob_txv_t p_Var1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  long lVar7;
  
  lVar7 = 0;
LAB_0010eaa2:
  do {
    if (count < 1) {
      return lVar7;
    }
    p_Var1 = (s->sbuf).txv;
    if (p_Var1 == (tnt_iob_txv_t)0x0) {
      while (uVar5 = writev(s->fd,(iovec *)iov,count), uVar5 == 0xffffffffffffffff) {
        piVar6 = __errno_location();
        if (*piVar6 != 4) goto LAB_0010eb3c;
      }
    }
    else {
      iVar3 = getiovmax();
      iVar4 = count;
      if (iVar3 <= count) {
        iVar4 = getiovmax();
      }
      uVar5 = (*p_Var1)(&s->sbuf,iov,iVar4);
    }
    if ((long)uVar5 < 1) {
      piVar6 = __errno_location();
LAB_0010eb3c:
      s->error = TNT_ESYSTEM;
      s->errno_ = *piVar6;
      return -1;
    }
    lVar7 = lVar7 + uVar5;
    if (all == 0) {
      return lVar7;
    }
    for (; 0 < count; count = count + -1) {
      uVar2 = ((iovec *)iov)->iov_len;
      if (uVar5 <= uVar2 && uVar2 - uVar5 != 0) {
        ((iovec *)iov)->iov_base = (void *)((long)((iovec *)iov)->iov_base + uVar5);
        ((iovec *)iov)->iov_len = uVar2 - uVar5;
        goto LAB_0010eaa2;
      }
      uVar5 = uVar5 - uVar2;
      iov = (iovec *)((iovec *)iov + 1);
    }
    count = 0;
  } while( true );
}

Assistant:

ssize_t
tnt_io_sendv_raw(struct tnt_stream_net *s, struct iovec *iov, int count, int all)
{
	size_t total = 0;
	while (count > 0) {
		ssize_t r;
		if (s->sbuf.txv) {
			r = s->sbuf.txv(&s->sbuf, iov, MIN(count, getiovmax()));
		} else {
			do {
				r = writev(s->fd, iov, count);
			} while (r == -1 && (errno == EINTR));
		}
		if (r <= 0) {
			s->error = TNT_ESYSTEM;
			s->errno_ = errno;
			return -1;
		}
		total += r;
		if (!all)
			break;
		while (count > 0) {
			if (iov->iov_len > (size_t)r) {
				iov->iov_base += r;
				iov->iov_len -= r;
				break;
			} else {
				r -= iov->iov_len;
				iov++;
				count--;
			}
		}
	}
	return total;
}